

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_index_list.cpp
# Opt level: O2

void __thiscall
duckdb::TableIndexList::InitializeIndexes
          (TableIndexList *this,ClientContext *context,DataTableInfo *table_info,char *index_type)

{
  pointer puVar1;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *puVar2;
  _Head_base<0UL,_duckdb::Index_*,_false> _Var3;
  undefined1 auVar4 [8];
  bool bVar5;
  int iVar6;
  pointer pIVar7;
  undefined4 extraout_var;
  Catalog *this_00;
  TableCatalogEntry *this_01;
  ColumnList *this_02;
  ColumnDefinition *this_03;
  LogicalType *__x;
  string *__x_00;
  undefined4 extraout_var_00;
  Binder *pBVar8;
  type binder_00;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *this_04;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer this_05;
  ColumnListIterator CVar9;
  undefined1 local_160 [8];
  shared_ptr<duckdb::Binder,_true> binder;
  ColumnLogicalIteratorInternal __end1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  vector<duckdb::LogicalType,_true> column_types;
  string table_name;
  string schema;
  ColumnLogicalIteratorInternal __begin1;
  
  ::std::mutex::lock(&this->indexes_lock);
  this_05 = (this->indexes).
            super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->indexes).
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_05 == puVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return;
    }
    pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                       (this_05);
    iVar6 = (*pIVar7->_vptr_Index[2])(pIVar7);
    if ((char)iVar6 == '\0') break;
LAB_00556f07:
    this_05 = this_05 + 1;
  }
  if (index_type != (char *)0x0) {
    pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                       (this_05);
    iVar6 = (*pIVar7->_vptr_Index[3])(pIVar7);
    bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(extraout_var,iVar6),index_type);
    if (!bVar5) goto LAB_00556f07;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  this_00 = AttachedDatabase::GetCatalog(table_info->db);
  ::std::__cxx11::string::string((string *)&schema,(string *)&table_info->schema);
  DataTableInfo::GetTableName_abi_cxx11_(&table_name,table_info);
  this_01 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                      (this_00,context,&schema,&table_name,(QueryErrorContext)0xffffffffffffffff);
  column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  column_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  column_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  column_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_02 = TableCatalogEntry::GetColumns(this_01);
  CVar9 = ColumnList::Logical(this_02);
  binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CVar9.list;
  binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_1_ = CVar9.physical;
  ColumnList::ColumnListIterator::begin(&__begin1,(ColumnListIterator *)&binder);
  ColumnList::ColumnListIterator::end(&__end1,(ColumnListIterator *)&binder);
  while (((__begin1.pos != __end1.pos || (__begin1.end != __end1.end)) ||
         (__begin1.list != __end1.list))) {
    this_03 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*(&__begin1);
    __x = ColumnDefinition::Type(this_03);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
               ,__x);
    __x_00 = ColumnDefinition::Name_abi_cxx11_(this_03);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&column_names,__x_00);
    __begin1.pos = __begin1.pos + 1;
  }
  ::std::mutex::lock(&this->indexes_lock);
  this_04 = (this->indexes).
            super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->indexes).
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_04 == puVar2) {
      pthread_mutex_unlock((pthread_mutex_t *)this);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&column_names);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&column_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      ::std::__cxx11::string::~string((string *)&table_name);
      ::std::__cxx11::string::~string((string *)&schema);
      return;
    }
    pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                       (this_04);
    iVar6 = (*pIVar7->_vptr_Index[2])(pIVar7);
    if ((char)iVar6 == '\0') {
      if (index_type != (char *)0x0) {
        pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                           (this_04);
        iVar6 = (*pIVar7->_vptr_Index[3])(pIVar7);
        bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(extraout_var_00,iVar6),index_type);
        if (!bVar5) goto LAB_005571b8;
      }
      Binder::CreateBinder
                ((Binder *)&binder,context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
      __end1.list = (ColumnList *)0x0;
      __end1.physical = false;
      __end1._9_7_ = 0;
      __end1.pos = 0;
      pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
      __begin1.list = (ColumnList *)&__begin1.pos;
      __begin1.physical = false;
      __begin1._9_7_ = 0;
      __begin1.pos = __begin1.pos & 0xffffffffffffff00;
      BindContext::AddBaseTable
                (&pBVar8->bind_context,0,(string *)&__begin1,&column_names,&column_types,
                 (vector<duckdb::ColumnIndex,_true> *)&__end1,this_01,true);
      ::std::__cxx11::string::~string((string *)&__begin1);
      binder_00 = shared_ptr<duckdb::Binder,_true>::operator*(&binder);
      IndexBinder::IndexBinder
                ((IndexBinder *)&__begin1,binder_00,context,
                 (optional_ptr<duckdb::TableCatalogEntry,_true>)0x0,
                 (optional_ptr<duckdb::CreateIndexInfo,_true>)0x0);
      unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->(this_04);
      IndexBinder::BindIndex((IndexBinder *)local_160,(UnboundIndex *)&__begin1);
      auVar4 = local_160;
      local_160 = (undefined1  [8])0x0;
      _Var3._M_head_impl =
           (this_04->super_unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>_>)._M_t.
           super___uniq_ptr_impl<duckdb::Index,_std::default_delete<duckdb::Index>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Index_*,_std::default_delete<duckdb::Index>_>.
           super__Head_base<0UL,_duckdb::Index_*,_false>._M_head_impl;
      (this_04->super_unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Index,_std::default_delete<duckdb::Index>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Index_*,_std::default_delete<duckdb::Index>_>.
      super__Head_base<0UL,_duckdb::Index_*,_false>._M_head_impl = (Index *)auVar4;
      if (_Var3._M_head_impl != (Index *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_Index + 8))();
      }
      if (local_160 != (undefined1  [8])0x0) {
        (*(*(_func_int ***)local_160)[1])();
      }
      ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&__begin1);
      ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)&__end1);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
LAB_005571b8:
    this_04 = this_04 + 1;
  } while( true );
}

Assistant:

void TableIndexList::InitializeIndexes(ClientContext &context, DataTableInfo &table_info, const char *index_type) {
	// Fast path: do we have any unbound indexes?
	bool needs_binding = false;
	{
		lock_guard<mutex> lock(indexes_lock);
		for (auto &index : indexes) {
			if (!index->IsBound() && (index_type == nullptr || index->GetIndexType() == index_type)) {
				needs_binding = true;
				break;
			}
		}
	}
	if (!needs_binding) {
		return;
	}

	// Get the table from the catalog, so we can add it to the binder.
	auto &catalog = table_info.GetDB().GetCatalog();
	auto schema = table_info.GetSchemaName();
	auto table_name = table_info.GetTableName();
	auto &table_entry = catalog.GetEntry<TableCatalogEntry>(context, schema, table_name);
	auto &table = table_entry.Cast<DuckTableEntry>();

	vector<LogicalType> column_types;
	vector<string> column_names;
	for (auto &col : table.GetColumns().Logical()) {
		column_types.push_back(col.Type());
		column_names.push_back(col.Name());
	}

	lock_guard<mutex> lock(indexes_lock);
	for (auto &index : indexes) {
		if (!index->IsBound() && (index_type == nullptr || index->GetIndexType() == index_type)) {
			// Create a binder to bind this index.
			auto binder = Binder::CreateBinder(context);

			// Add the table to the binder.
			vector<ColumnIndex> dummy_column_ids;
			binder->bind_context.AddBaseTable(0, string(), column_names, column_types, dummy_column_ids, table);

			// Create an IndexBinder to bind the index
			IndexBinder idx_binder(*binder, context);

			// Replace the unbound index with a bound index.
			auto bound_idx = idx_binder.BindIndex(index->Cast<UnboundIndex>());
			index = std::move(bound_idx);
		}
	}
}